

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O3

Employee * __thiscall Employee::operator=(Employee *this,Employee *e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  Address *address;
  
  psVar4 = Person::getName_abi_cxx11_(&e->super_Person);
  Person::setName(&this->super_Person,psVar4);
  psVar4 = Person::getId_abi_cxx11_(&e->super_Person);
  Person::setId(&this->super_Person,psVar4);
  address = Person::getAddress(&e->super_Person);
  Person::setAddress(&this->super_Person,address);
  iVar1 = e->salaryPerHour;
  iVar2 = e->workToDo;
  iVar3 = e->workDone;
  this->hourWork = e->hourWork;
  this->salaryPerHour = iVar1;
  this->workToDo = iVar2;
  this->workDone = iVar3;
  return this;
}

Assistant:

Employee &Employee::operator=(const Employee &e) {

    this->setName(e.getName());
    this->setId(e.getId());
    this->setAddress(e.getAddress());
    hourWork = e.hourWork;
    salaryPerHour = e.salaryPerHour;
    workDone = e.workDone;
    workToDo = e.workToDo;
    return *this;
}